

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O1

void cdef_copy_rect8_8bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  long lVar8;
  uint16_t *puVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  ulong *puVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  uint16_t *puVar19;
  long lVar20;
  int iVar21;
  uint8_t *puVar22;
  
  iVar21 = 0;
  lVar20 = (long)height;
  lVar7 = (long)dstride;
  lVar8 = (long)sstride;
  uVar12 = width;
  if (0x1f < width) {
    puVar9 = dst + lVar7 + 0x10;
    puVar19 = dst + 0x10;
    puVar22 = src + lVar8 + 0x10;
    puVar11 = src + 0x10;
    lVar17 = 0;
    do {
      lVar16 = 0;
      do {
        auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar11 + lVar16 + -0x10));
        auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar11 + lVar16));
        auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar22 + lVar16 + -0x10));
        auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar22 + lVar16));
        *(undefined1 (*) [32])(puVar19 + lVar16 + -0x10) = auVar3;
        *(undefined1 (*) [32])(puVar19 + lVar16) = auVar4;
        *(undefined1 (*) [32])(puVar9 + lVar16 + -0x10) = auVar5;
        *(undefined1 (*) [32])(puVar9 + lVar16) = auVar6;
        lVar16 = lVar16 + 0x20;
      } while (lVar16 <= (int)(width - 0x20U));
      lVar17 = lVar17 + 2;
      puVar9 = puVar9 + lVar7 * 2;
      puVar19 = puVar19 + lVar7 * 2;
      puVar22 = puVar22 + lVar8 * 2;
      puVar11 = puVar11 + lVar8 * 2;
    } while (lVar17 < lVar20);
    iVar21 = (width - 0x20U & 0xffffffe0) + 0x20;
    uVar12 = width & 0x1f;
  }
  if (0xf < (int)uVar12) {
    pauVar13 = (undefined1 (*) [16])(src + iVar21);
    pauVar18 = (undefined1 (*) [32])(dst + iVar21);
    lVar17 = 0;
    do {
      auVar3 = vpmovzxbw_avx2(*pauVar13);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*pauVar13 + lVar8));
      *pauVar18 = auVar3;
      *(undefined1 (*) [32])(*pauVar18 + lVar7 * 2) = auVar4;
      lVar17 = lVar17 + 2;
      pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar8 * 2);
      pauVar18 = (undefined1 (*) [32])(*pauVar18 + lVar7 * 4);
    } while (lVar17 < lVar20);
    uVar12 = width & 0xf;
    iVar21 = iVar21 + 0x10;
  }
  if (7 < (int)uVar12) {
    puVar14 = (ulong *)(src + iVar21);
    pauVar13 = (undefined1 (*) [16])(dst + iVar21);
    lVar17 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar14;
      auVar1 = vpmovzxbw_avx(auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)puVar14 + lVar8);
      auVar2 = vpmovzxbw_avx(auVar2);
      *pauVar13 = auVar1;
      *(undefined1 (*) [16])(*pauVar13 + lVar7 * 2) = auVar2;
      lVar17 = lVar17 + 2;
      puVar14 = (ulong *)((long)puVar14 + lVar8 * 2);
      pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar7 * 4);
    } while (lVar17 < lVar20);
    uVar12 = width & 7;
    iVar21 = iVar21 + 8;
  }
  if (3 < (int)uVar12) {
    puVar15 = (uint *)(src + iVar21);
    puVar19 = dst + iVar21;
    lVar17 = 0;
    do {
      uVar12 = *(uint *)((long)puVar15 + lVar8);
      auVar1 = vpmovzxbw_avx(ZEXT416(*puVar15));
      *(long *)puVar19 = auVar1._0_8_;
      auVar1 = vpmovzxbw_avx(ZEXT416(uVar12));
      *(long *)(puVar19 + lVar7) = auVar1._0_8_;
      lVar17 = lVar17 + 2;
      puVar15 = (uint *)((long)puVar15 + lVar8 * 2);
      puVar19 = puVar19 + lVar7 * 2;
    } while (lVar17 < lVar20);
    uVar12 = width & 3;
    iVar21 = iVar21 + 4;
  }
  if (0 < height && uVar12 != 0) {
    uVar10 = 0;
    do {
      lVar20 = (long)iVar21;
      if (iVar21 < width) {
        do {
          dst[lVar20] = (ushort)src[lVar20];
          lVar20 = lVar20 + 1;
        } while (width != lVar20);
      }
      uVar10 = uVar10 + 1;
      dst = dst + lVar7;
      src = src + lVar8;
    } while (uVar10 != (uint)height);
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_avx2(uint16_t *dst, int dstride,
                                        const uint8_t *src, int sstride,
                                        int width, int height) {
  int j = 0;
  int remaining_width = width;
  assert(height % 2 == 0);
  assert(height > 0);
  assert(width > 0);

  // Process multiple 32 pixels at a time.
  if (remaining_width > 31) {
    int i = 0;
    do {
      j = 0;
      do {
        __m128i row00 =
            _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + (j + 0)]);
        __m128i row01 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 0) * sstride + (j + 16)]);
        __m128i row10 =
            _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + (j + 0)]);
        __m128i row11 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 1) * sstride + (j + 16)]);
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row00));
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row01));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row10));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row11));
        j += 32;
      } while (j <= width - 32);
      i += 2;
    } while (i < height);
    remaining_width = width & 31;
  }

  // Process 16 pixels at a time.
  if (remaining_width > 15) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + j],
                          _mm256_cvtepu8_epi16(row0));
      _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + j],
                          _mm256_cvtepu8_epi16(row1));
      i += 2;
    } while (i < height);
    remaining_width = width & 15;
    j += 16;
  }

  // Process 8 pixels at a time.
  if (remaining_width > 7) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm_storeu_si128((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storeu_si128((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 7;
    j += 8;
  }

  // Process 4 pixels at a time.
  if (remaining_width > 3) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 0) * sstride + j]));
      __m128i row1 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 1) * sstride + j]));
      _mm_storel_epi64((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storel_epi64((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 3;
    j += 4;
  }

  // Process the remaining pixels.
  if (remaining_width) {
    for (int i = 0; i < height; i++) {
      for (int k = j; k < width; k++) {
        dst[i * dstride + k] = src[i * sstride + k];
      }
    }
  }
}